

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O3

id_type __thiscall
Darts::Details::DoubleArrayBuilder::arrange_from_dawg
          (DoubleArrayBuilder *this,DawgBuilder *dawg,id_type dawg_id,id_type dic_id)

{
  id_type iVar1;
  uint uVar2;
  byte *pbVar3;
  char *pcVar4;
  DoubleArrayBuilderExtraUnit *pDVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uchar local_49;
  AutoPool<unsigned_char> *local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar11;
  
  local_48 = &this->labels_;
  AutoPool<unsigned_char>::resize(local_48,0);
  local_40 = (ulong)dawg_id;
  uVar6 = *(uint *)((dawg->units_).buf_.array_ + local_40 * 4);
  if (3 < uVar6) {
    uVar6 = uVar6 >> 2;
    do {
      uVar9 = (ulong)uVar6;
      local_49 = (dawg->labels_).buf_.array_[uVar9];
      AutoPool<unsigned_char>::append(local_48,&local_49);
      uVar6 = uVar6 + 1;
      if (((dawg->units_).buf_.array_[uVar9 * 4] & 1U) == 0) break;
    } while (uVar6 != 0);
  }
  uVar6 = this->extras_head_;
  uVar9 = (this->units_).size_;
  if (uVar6 < uVar9) {
    pDVar5 = (this->extras_).array_;
    pbVar3 = (byte *)(this->labels_).buf_.array_;
    uVar11 = (this->labels_).size_;
    uVar10 = uVar6;
    do {
      uVar7 = uVar10 ^ *pbVar3;
      if ((pDVar5[uVar7 & 0xfff].is_used_ == false) &&
         ((char)(uVar7 ^ dic_id) == '\0' || ((uVar7 ^ dic_id) & 0x1fe00000) == 0)) {
        if (uVar11 < 2) goto LAB_0013a2f5;
        uVar8 = 1;
        while (pDVar5[(uint)pbVar3[uVar8] ^ uVar7 & 0xfff].is_fixed_ != true) {
          uVar8 = uVar8 + 1;
          if (uVar11 == uVar8) goto LAB_0013a2f5;
        }
      }
      uVar10 = pDVar5[uVar10 & 0xfff].next_;
    } while (uVar10 != uVar6);
  }
  uVar7 = (uint)uVar9 | dic_id & 0xff;
LAB_0013a2f5:
  local_38 = (ulong)dic_id;
  DoubleArrayBuilderUnit::set_offset
            ((DoubleArrayBuilderUnit *)((this->units_).buf_.array_ + local_38 * 4),dic_id ^ uVar7);
  if ((this->labels_).size_ == 0) {
    pDVar5 = (this->extras_).array_;
  }
  else {
    uVar6 = *(uint *)((dawg->units_).buf_.array_ + local_40 * 4) >> 2;
    uVar9 = 0;
    do {
      uVar10 = (byte)(this->labels_).buf_.array_[uVar9] ^ uVar7;
      uVar11 = (ulong)uVar10;
      if ((this->units_).size_ <= uVar11) {
        expand_units(this);
      }
      if (this->extras_head_ == uVar10) {
        uVar8 = (ulong)(uVar10 & 0xfff);
        pDVar5 = (this->extras_).array_;
        iVar1 = pDVar5[uVar8].next_;
        this->extras_head_ = iVar1;
        if (iVar1 == uVar10) {
          this->extras_head_ = (id_type)(this->units_).size_;
        }
      }
      else {
        pDVar5 = (this->extras_).array_;
        uVar8 = (ulong)(uVar10 & 0xfff);
      }
      uVar10 = pDVar5[uVar8].prev_;
      uVar2 = pDVar5[uVar8].next_;
      pDVar5[(ulong)uVar10 & 0xfff].next_ = uVar2;
      pDVar5[(ulong)uVar2 & 0xfff].prev_ = uVar10;
      pDVar5[uVar8].is_fixed_ = true;
      uVar8 = (ulong)uVar6;
      pcVar4 = (this->units_).buf_.array_;
      if ((dawg->labels_).buf_.array_[uVar8] == '\0') {
        pcVar4[local_38 * 4 + 1] = pcVar4[local_38 * 4 + 1] | 1;
        uVar10 = *(uint *)((dawg->units_).buf_.array_ + uVar8 * 4);
        *(uint *)(pcVar4 + uVar11 * 4) = uVar10 >> 1 | 0x80000000;
      }
      else {
        pcVar4[uVar11 * 4] = (local_48->buf_).array_[uVar9];
        uVar10 = *(uint *)((dawg->units_).buf_.array_ + uVar8 * 4);
      }
      uVar6 = uVar6 + 1 & -(uVar10 & 1);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->labels_).size_);
  }
  pDVar5[uVar7 & 0xfff].is_used_ = true;
  return uVar7;
}

Assistant:

inline id_type DoubleArrayBuilder::arrange_from_dawg(const DawgBuilder &dawg,
    id_type dawg_id, id_type dic_id) {
  labels_.resize(0);

  id_type dawg_child_id = dawg.child(dawg_id);
  while (dawg_child_id != 0) {
    labels_.append(dawg.label(dawg_child_id));
    dawg_child_id = dawg.sibling(dawg_child_id);
  }

  id_type offset = find_valid_offset(dic_id);
  units_[dic_id].set_offset(dic_id ^ offset);

  dawg_child_id = dawg.child(dawg_id);
  for (std::size_t i = 0; i < labels_.size(); ++i) {
    id_type dic_child_id = offset ^ labels_[i];
    reserve_id(dic_child_id);

    if (dawg.is_leaf(dawg_child_id)) {
      units_[dic_id].set_has_leaf(true);
      units_[dic_child_id].set_value(dawg.value(dawg_child_id));
    } else {
      units_[dic_child_id].set_label(labels_[i]);
    }

    dawg_child_id = dawg.sibling(dawg_child_id);
  }
  extras(offset).set_is_used(true);

  return offset;
}